

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int array_container_index_equalorlarger(array_container_t *arr,uint16_t x)

{
  int32_t candidate;
  _Bool is_present;
  int32_t idx;
  uint16_t x_local;
  array_container_t *arr_local;
  
  arr_local._4_4_ = binarySearch(arr->array,arr->cardinality,x);
  if ((arr_local._4_4_ < 0) &&
     (arr_local._4_4_ = -1 - arr_local._4_4_, arr->cardinality <= arr_local._4_4_)) {
    arr_local._4_4_ = -1;
  }
  return arr_local._4_4_;
}

Assistant:

inline int array_container_index_equalorlarger(const array_container_t *arr, uint16_t x) {
    const int32_t idx = binarySearch(arr->array, arr->cardinality, x);
    const bool is_present = idx >= 0;
    if (is_present) {
        return idx;
    } else {
        int32_t candidate = - idx - 1;
        if(candidate < arr->cardinality) return candidate;
        return -1;
    }
}